

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

iterator * __thiscall
obs::safe_list<obs::slot<void_(int)>_>::end
          (iterator *__return_storage_ptr__,safe_list<obs::slot<void_(int)>_> *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  safe_list<obs::slot<void_(int)>_> *this_local;
  
  lock._M_device = &this->m_mutex_nodes;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_mutex_nodes);
  iterator::iterator(__return_storage_ptr__,this,this->m_last);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

iterator end() {
    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    return iterator(*this, m_last);
  }